

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::SkipPrefix(char *prefix,char **pstr)

{
  int iVar1;
  size_t __n;
  size_t prefix_len;
  char **pstr_local;
  char *prefix_local;
  
  __n = strlen(prefix);
  iVar1 = strncmp(*pstr,prefix,__n);
  if (iVar1 == 0) {
    *pstr = *pstr + __n;
  }
  return iVar1 == 0;
}

Assistant:

bool SkipPrefix(const char* prefix, const char** pstr) {
  const size_t prefix_len = strlen(prefix);
  if (strncmp(*pstr, prefix, prefix_len) == 0) {
    *pstr += prefix_len;
    return true;
  }
  return false;
}